

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O0

void rx_summary_terminate(rx_summary *summary)

{
  rx_failure *prVar1;
  rx_failure *failure;
  size_t i;
  rx_summary *summary_local;
  
  if (summary == (rx_summary *)0x0) {
    __assert_fail("summary != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x18dd,"void rx_summary_terminate(struct rx_summary *)");
  }
  if (summary->failures != (rx_failure *)0x0) {
    for (failure = (rx_failure *)0x0; failure < (rx_failure *)summary->failure_count;
        failure = (rx_failure *)((long)&failure->file + 1)) {
      prVar1 = summary->failures + (long)failure;
      free(prVar1->file);
      free(prVar1->msg);
      free(prVar1->diagnostic_msg);
    }
    rx__test_failure_array_destroy(summary->failures);
    return;
  }
  __assert_fail("summary->failures != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x18de,"void rx_summary_terminate(struct rx_summary *)");
}

Assistant:

RX__MAYBE_UNUSED RX__STORAGE void
rx_summary_terminate(struct rx_summary *summary)
{
    size_t i;

    RX_ASSERT(summary != NULL);
    RX_ASSERT(summary->failures != NULL);

    for (i = 0; i < summary->failure_count; ++i) {
        const struct rx_failure *failure;

        failure = &summary->failures[i];

        RX_FREE((void *)(uintptr_t)failure->file);
        RX_FREE((void *)(uintptr_t)failure->msg);
        RX_FREE((void *)(uintptr_t)failure->diagnostic_msg);
    }

    rx__test_failure_array_destroy(summary->failures);
}